

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactBvh.cpp
# Opt level: O1

void __thiscall
cbtBvhTree::_build_sub_tree
          (cbtBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes,int startIndex,int endIndex)

{
  GIM_BVH_DATA *pGVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined1 auVar4 [16];
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  cbtScalar *pcVar10;
  cbtBvhTree *this_00;
  long lVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined4 uVar14;
  undefined1 auVar15 [64];
  undefined4 uVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  
  iVar3 = *(int *)this;
  *(int *)this = iVar3 + 1;
  if (endIndex - startIndex == 1) {
    lVar11 = (long)iVar3 * 0x24;
    pGVar1 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data + startIndex;
    uVar6 = *(undefined8 *)((pGVar1->m_bound).m_min.m_floats + 2);
    uVar7 = *(undefined8 *)(pGVar1->m_bound).m_max.m_floats;
    uVar8 = *(undefined8 *)((pGVar1->m_bound).m_max.m_floats + 2);
    puVar2 = (undefined8 *)(*(long *)(this + 0x18) + lVar11);
    *puVar2 = *(undefined8 *)(pGVar1->m_bound).m_min.m_floats;
    puVar2[1] = uVar6;
    puVar2[2] = uVar7;
    puVar2[3] = uVar8;
    *(int *)(*(long *)(this + 0x18) + 0x20 + lVar11) =
         (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data[startIndex].m_data;
  }
  else {
    this_00 = this;
    iVar9 = _calc_splitting_axis(this,primitive_boxes,startIndex,endIndex);
    iVar9 = _sort_and_calc_splitting_index(this_00,primitive_boxes,startIndex,endIndex,iVar9);
    if (startIndex < endIndex) {
      pcVar10 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data[startIndex].
                m_bound.m_max.m_floats + 2;
      lVar11 = (long)endIndex - (long)startIndex;
      auVar12 = ZEXT464(0xff7fffff);
      auVar18 = ZEXT464(0x7f7fffff);
      auVar19 = ZEXT1664(auVar18._0_16_);
      auVar13 = ZEXT1664(auVar18._0_16_);
      auVar17 = ZEXT1664(auVar12._0_16_);
      auVar15 = ZEXT1664(auVar12._0_16_);
      do {
        if (auVar15._0_4_ < pcVar10[-1]) {
          auVar15 = ZEXT464((uint)pcVar10[-1]);
        }
        uVar14 = auVar15._0_4_;
        if (auVar17._0_4_ < *pcVar10) {
          auVar17 = ZEXT464((uint)*pcVar10);
        }
        uVar16 = auVar17._0_4_;
        auVar4 = vminss_avx(ZEXT416((uint)pcVar10[-6]),auVar18._0_16_);
        auVar18 = ZEXT1664(auVar4);
        auVar4 = vminss_avx(ZEXT416((uint)pcVar10[-5]),auVar19._0_16_);
        auVar19 = ZEXT1664(auVar4);
        auVar4 = vminss_avx(ZEXT416((uint)pcVar10[-4]),auVar13._0_16_);
        auVar13 = ZEXT1664(auVar4);
        auVar4 = vmaxss_avx(ZEXT416((uint)((cbtVector3 *)(pcVar10 + -2))->m_floats[0]),
                            auVar12._0_16_);
        auVar12 = ZEXT1664(auVar4);
        pcVar10 = pcVar10 + 9;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    else {
      auVar13 = ZEXT464(0x7f7fffff);
      uVar14 = 0xff7fffff;
      uVar16 = 0xff7fffff;
      auVar12 = ZEXT1664(SUB6416(ZEXT464(0xff7fffff),0));
      auVar19 = ZEXT1664(auVar13._0_16_);
      auVar18 = ZEXT1664(auVar13._0_16_);
    }
    lVar11 = *(long *)(this + 0x18);
    lVar5 = (long)iVar3 * 0x24;
    *(int *)(lVar11 + lVar5) = auVar18._0_4_;
    *(int *)(lVar11 + 4 + lVar5) = auVar19._0_4_;
    *(int *)(lVar11 + 8 + lVar5) = auVar13._0_4_;
    *(int *)(lVar11 + 0x10 + lVar5) = auVar12._0_4_;
    *(undefined4 *)(lVar11 + 0x14 + lVar5) = uVar14;
    *(undefined4 *)(lVar11 + 0x18 + lVar5) = uVar16;
    _build_sub_tree(this,primitive_boxes,startIndex,iVar9);
    _build_sub_tree(this,primitive_boxes,iVar9,endIndex);
    *(int *)(*(long *)(this + 0x18) + 0x20 + lVar5) = iVar3 - *(int *)this;
  }
  return;
}

Assistant:

void cbtBvhTree::_build_sub_tree(GIM_BVH_DATA_ARRAY& primitive_boxes, int startIndex, int endIndex)
{
	int curIndex = m_num_nodes;
	m_num_nodes++;

	cbtAssert((endIndex - startIndex) > 0);

	if ((endIndex - startIndex) == 1)
	{
		//We have a leaf node
		setNodeBound(curIndex, primitive_boxes[startIndex].m_bound);
		m_node_array[curIndex].setDataIndex(primitive_boxes[startIndex].m_data);

		return;
	}
	//calculate Best Splitting Axis and where to split it. Sort the incoming 'leafNodes' array within range 'startIndex/endIndex'.

	//split axis
	int splitIndex = _calc_splitting_axis(primitive_boxes, startIndex, endIndex);

	splitIndex = _sort_and_calc_splitting_index(
		primitive_boxes, startIndex, endIndex,
		splitIndex  //split axis
	);

	//calc this node bounding box

	cbtAABB node_bound;
	node_bound.invalidate();

	for (int i = startIndex; i < endIndex; i++)
	{
		node_bound.merge(primitive_boxes[i].m_bound);
	}

	setNodeBound(curIndex, node_bound);

	//build left branch
	_build_sub_tree(primitive_boxes, startIndex, splitIndex);

	//build right branch
	_build_sub_tree(primitive_boxes, splitIndex, endIndex);

	m_node_array[curIndex].setEscapeIndex(m_num_nodes - curIndex);
}